

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::
GetConstant<spvtools::utils::SmallVector<unsigned_int,2ul>>
          (ConstantManager *this,Type *type,SmallVector<unsigned_int,_2UL> *literal_words_or_ids)

{
  uint **ppuVar1;
  uint *puVar2;
  const_iterator puVar3;
  Constant *pCVar4;
  uint **ppuVar5;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  ppuVar1 = (uint **)(literal_words_or_ids->large_data_)._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
  ppuVar5 = &literal_words_or_ids->small_data_;
  if (ppuVar1 != (uint **)0x0) {
    ppuVar5 = ppuVar1;
  }
  puVar2 = *ppuVar5;
  puVar3 = utils::SmallVector<unsigned_int,_2UL>::end(literal_words_or_ids);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,puVar2,puVar3);
  pCVar4 = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return pCVar4;
}

Assistant:

const Constant* GetConstant(const Type* type, const C& literal_words_or_ids) {
    return GetConstant(type, std::vector<uint32_t>(literal_words_or_ids.begin(),
                                                   literal_words_or_ids.end()));
  }